

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTankType::~IfcTankType(IfcTankType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcFlowStorageDeviceType).
                              super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject + -0x18)
  ;
  this_00 = (IfcTypeProduct *)
            ((long)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
                    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1d0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1d0) = 0x8a57e0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x8a5948;
  *(undefined8 *)((long)pvVar1 + -0x148) = 0x8a5808;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x8a5830;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8a5858;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x8a5880;
  *(undefined8 *)((long)pvVar1 + -0x50) = 0x8a58a8;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x8a58d0;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x8a58f8;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8a5920;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x8a5f70;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x80 = 0x8a6038;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x8a5f98;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8a5fc0;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x8a5fe8;
  *(undefined8 *)&this_00->field_0x148 = 0x8a6010;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__008a5980);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTankType() : Object("IfcTankType") {}